

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O0

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,RegRegList l)

{
  Syntax SVar1;
  RegList local_22;
  RegList local_20;
  ushort local_1e;
  ushort local_1c;
  RegList local_1a;
  u16 regsA;
  u16 regsD;
  StrWriter *pSStack_18;
  StrWriter *this_local;
  RegRegList l_local;
  
  SVar1 = this->style->syntax;
  pSStack_18 = this;
  this_local._6_2_ = l.raw;
  if (SVar1 == GNU || SVar1 == GNU_MIT) {
    if (l.raw == 0) {
      operator<<(this,"#0");
    }
    else {
      RegList::RegList(&local_1a,l.raw);
      operator<<(this,local_1a);
    }
  }
  else {
    local_1c = l.raw & 0xff;
    local_1e = l.raw & 0xff00;
    RegList::RegList(&local_20,local_1c);
    operator<<(this,local_20);
    if ((local_1c != 0) && (local_1e != 0)) {
      operator<<(this,"/");
    }
    RegList::RegList(&local_22,local_1e);
    operator<<(this,local_22);
  }
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(RegRegList l)
{
    switch (style.syntax) {

       case Syntax::GNU:
        case Syntax::GNU_MIT:

            l.raw ? *this << RegList{l.raw} : *this << "#0";
            break;

        default:

            u16 regsD = l.raw & 0x00FF;
            u16 regsA = l.raw & 0xFF00;

            *this << RegList { regsD };
            if (regsD && regsA) *this << "/";
            *this << RegList { regsA };
    }

    return *this;
}